

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  char *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  Token token;
  undefined1 local_88 [32];
  Token local_68;
  String local_50;
  
  bVar6 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar6);
  this->current_ = beginDoc;
  (this->commentsBefore_)._M_string_length = 0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (&this->errors_);
  while (ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppVVar2 !=
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_88._0_8_ = root;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_88);
  }
  else {
    *ppVVar2 = root;
    piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (((((this->features_).skipBom_ == true) &&
       (pcVar3 = this->begin_, 2 < (long)this->end_ - (long)pcVar3)) && (*pcVar3 == -0x11)) &&
     ((pcVar3[1] == -0x45 && (pcVar3[2] == -0x41)))) {
    this->begin_ = pcVar3 + 3;
    this->current_ = pcVar3 + 3;
  }
  bVar6 = readValue(this);
  std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
            ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  readTokenSkippingComments(this,&local_68);
  if (((this->features_).failIfExtra_ == true) && (local_68.type_ != tokenEndOfStream)) {
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Extra non-whitespace after JSON value.","");
    addError(this,(String *)local_88,&local_68,(Location)0x0);
  }
  else {
    if ((this->collectComments_ == true) &&
       (sVar4 = (this->commentsBefore_)._M_string_length, sVar4 != 0)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar5 = (this->commentsBefore_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar5,pcVar5 + sVar4);
      Value::setComment(root,&local_50,commentAfter);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->features_).strictRoot_ != true) {
      return bVar6;
    }
    bVar7 = Value::isArray(root);
    if (bVar7) {
      return bVar6;
    }
    bVar7 = Value::isObject(root);
    if (bVar7) {
      return bVar6;
    }
    local_68.type_ = tokenError;
    local_88._0_8_ = local_88 + 0x10;
    local_68.start_ = beginDoc;
    local_68.end_ = endDoc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "A valid JSON document must be either an array or an object value.","");
    addError(this,(String *)local_88,&local_68,(Location)0x0);
  }
  if ((Value *)local_88._0_8_ != (Value *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return false;
}

Assistant:

bool OurReader::parse(const char* beginDoc, const char* endDoc, Value& root,
                      bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = nullptr;
  lastValue_ = nullptr;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  // skip byte order mark if it exists at the beginning of the UTF-8 text.
  skipBom(features_.skipBom_);
  bool successful = readValue();
  nodes_.pop();
  Token token;
  readTokenSkippingComments(token);
  if (features_.failIfExtra_ && (token.type_ != tokenEndOfStream)) {
    addError("Extra non-whitespace after JSON value.", token);
    return false;
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}